

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Socket> * __thiscall asl::Array<asl::Socket>::reserve(Array<asl::Socket> *this,int m)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 *puVar4;
  Socket *__src;
  int iVar5;
  
  __src = this->_a;
  iVar2 = *(int *)((long)&__src[-2].super_SmartObject._p + 4);
  if (iVar2 < m) {
    iVar5 = iVar2 * 2;
    if (iVar2 * 2 <= m) {
      iVar5 = m;
    }
    iVar1 = *(int *)&__src[-2].super_SmartObject._p;
    if (((long)iVar2 & 0x1fffffffffffff00U) == 0) {
      piVar3 = (int *)malloc((long)iVar5 * 8 + 0x10);
      if (piVar3 == (int *)0x0) goto LAB_00124fe6;
      if (iVar1 <= m) {
        m = iVar1;
      }
      memcpy((Socket *)(piVar3 + 4),__src,(long)(m << 3));
      if (iVar5 == iVar2) {
        return this;
      }
      dup(this,(int)__src);
      iVar2 = *(int *)&this->_a[-1].super_SmartObject._p;
      ::free(this->_a + -2);
      this->_a = (Socket *)(piVar3 + 4);
    }
    else {
      dup(this,m);
      iVar2 = *(int *)&this->_a[-1].super_SmartObject._p;
      piVar3 = (int *)realloc(this->_a + -2,(long)iVar5 * 8 + 0x10);
      if (piVar3 == (int *)0x0) {
LAB_00124fe6:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = dup2;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      this->_a = (Socket *)(piVar3 + 4);
    }
    piVar3[2] = iVar2;
    piVar3[1] = iVar5;
    *piVar3 = iVar1;
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}